

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_neg64_sparc(void *d,void *a,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    *(long *)((long)d + uVar2) = -*(long *)((long)a + uVar2);
    uVar2 = uVar2 + 8;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_neg64_sparc_cold_1();
  return;
}

Assistant:

void HELPER(gvec_neg64)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
#ifdef _MSC_VER
        *(uint64_t *)((char *)d + i) = 0ULL - *(uint64_t *)((char *)a + i);
#else
        *(uint64_t *)((char *)d + i) = -*(uint64_t *)((char *)a + i);
#endif
    }
    clear_high(d, oprsz, desc);
}